

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_t<double,double>
               (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action,
               double *x_sd,double *x_mean)

{
  double dVar1;
  long lVar2;
  size_t row;
  undefined1 auVar3 [16];
  double __z;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar4 = x[ix_arr[st]];
  if (missing_action != Fail) {
    do {
      if (NAN(dVar4)) {
        if (end < st) goto LAB_0016affa;
      }
      else if ((end < st) || (ABS(dVar4) != INFINITY)) goto LAB_0016affa;
      lVar2 = st + 1;
      st = st + 1;
      dVar4 = x[ix_arr[lVar2]];
    } while( true );
  }
  dVar6 = 0.0;
  lVar2 = 0;
  __z = 0.0;
  while (st + lVar2 <= end) {
    dVar1 = x[ix_arr[st + lVar2]];
    lVar2 = lVar2 + 1;
    auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar8._0_8_ = lVar2;
    auVar8._12_4_ = 0x45300000;
    dVar6 = dVar6 + (dVar1 - dVar6) /
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    __z = fma(dVar1 - dVar6,dVar1 - dVar4,__z);
    dVar4 = dVar6;
  }
  *x_mean = dVar6;
  lVar2 = (end - st) + 1;
LAB_0016b153:
  auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar3._0_8_ = lVar2;
  auVar3._12_4_ = 0x45300000;
  *x_sd = SQRT(__z / ((auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
  return;
LAB_0016affa:
  dVar6 = 0.0;
  lVar2 = 0;
  __z = 0.0;
  for (; st <= end; st = st + 1) {
    dVar1 = x[ix_arr[st]];
    dVar5 = dVar4;
    if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
      lVar2 = lVar2 + 1;
      auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar7._0_8_ = lVar2;
      auVar7._12_4_ = 0x45300000;
      dVar5 = dVar6 + (dVar1 - dVar6) /
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
      __z = fma(dVar1 - dVar5,dVar1 - dVar4,__z);
      dVar6 = dVar5;
    }
    dVar4 = dVar5;
  }
  *x_mean = dVar6;
  goto LAB_0016b153;
}

Assistant:

void calc_mean_and_sd_t(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x,
                        MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = x[ix_arr[st]];
    real_t xval;

    if (missing_action == Fail)
    {
        m_prev = x[ix_arr[st]];
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            m += (xval - m) / (real_t)(row - st + 1);
            s  = std::fma(xval - m, xval - m_prev, s);
            m_prev = m;
        }

        x_mean = m;
        x_sd   = std::sqrt(s / (real_t)(end - st + 1));
    }

    else
    {
        size_t cnt = 0;
        while (is_na_or_inf(m_prev) && st <= end)
        {
            m_prev = x[ix_arr[++st]];
        }

        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            if (likely(!is_na_or_inf(xval)))
            {
                cnt++;
                m += (xval - m) / (real_t)cnt;
                s  = std::fma(xval - m, xval - m_prev, s);
                m_prev = m;
            }
        }

        x_mean = m;
        x_sd   = std::sqrt(s / (real_t)cnt);
    }
}